

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

int check_immune(CHAR_DATA *ch,int dam_type)

{
  ulong uVar1;
  int in_ESI;
  long in_RDI;
  __type_conflict2 _Var2;
  int bit;
  int def;
  int immune;
  int local_1c;
  int local_18;
  int local_4;
  
  local_18 = -1;
  local_1c = 0;
  if (in_ESI == 0) {
    local_4 = -1;
  }
  else {
    if (in_ESI < 4) {
      uVar1 = *(ulong *)(in_RDI + 0x1b0);
      _Var2 = std::pow<int,int>(0,0x5f3772);
      if ((uVar1 & (long)_Var2) == 0) {
        uVar1 = *(ulong *)(in_RDI + 0x1c0);
        _Var2 = std::pow<int,int>(0,0x5f37af);
        if ((uVar1 & (long)_Var2) == 0) {
          uVar1 = *(ulong *)(in_RDI + 0x1d0);
          _Var2 = std::pow<int,int>(0,0x5f37ec);
          if ((uVar1 & (long)_Var2) != 0) {
            local_1c = 3;
          }
        }
        else {
          local_1c = 2;
        }
      }
      else {
        local_1c = 1;
      }
    }
    else {
      uVar1 = *(ulong *)(in_RDI + 0x1b0);
      _Var2 = std::pow<int,int>(0,0x5f382d);
      if ((uVar1 & (long)_Var2) == 0) {
        uVar1 = *(ulong *)(in_RDI + 0x1c0);
        _Var2 = std::pow<int,int>(0,0x5f3867);
        if ((uVar1 & (long)_Var2) == 0) {
          uVar1 = *(ulong *)(in_RDI + 0x1d0);
          _Var2 = std::pow<int,int>(0,0x5f38a1);
          if ((uVar1 & (long)_Var2) != 0) {
            local_1c = 3;
          }
        }
        else {
          local_1c = 2;
        }
      }
      else {
        local_1c = 1;
      }
    }
    switch(in_ESI) {
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
      break;
    case 6:
      break;
    case 7:
      break;
    case 8:
      break;
    case 9:
      break;
    case 10:
      break;
    case 0xb:
      break;
    case 0xc:
      break;
    case 0xd:
      break;
    case 0xe:
      break;
    case 0xf:
      break;
    default:
      return local_1c;
    case 0x11:
      break;
    case 0x12:
      break;
    case 0x14:
    }
    uVar1 = *(ulong *)(in_RDI + 0x1b0);
    _Var2 = std::pow<int,int>(0,0x5f3a08);
    if ((uVar1 & (long)_Var2) == 0) {
      uVar1 = *(ulong *)(in_RDI + 0x1c0);
      _Var2 = std::pow<int,int>(0,0x5f3a6d);
      if ((uVar1 & (long)_Var2) == 0) {
        uVar1 = *(ulong *)(in_RDI + 0x1d0);
        _Var2 = std::pow<int,int>(0,0x5f3ad7);
        if ((uVar1 & (long)_Var2) != 0) {
          local_18 = 3;
        }
      }
      else {
        local_18 = 2;
      }
    }
    else {
      local_18 = 1;
    }
    if (local_18 == -1) {
      local_4 = local_1c;
    }
    else {
      local_4 = local_18;
    }
  }
  return local_4;
}

Assistant:

int check_immune(CHAR_DATA *ch, int dam_type)
{
	int immune, def;
	int bit;

	immune = -1;
	def = IS_NORMAL;

	if (dam_type == DAM_NONE)
		return immune;

	if (dam_type <= 3)
	{
		if (IS_SET(ch->imm_flags, IMM_WEAPON))
			def = IS_IMMUNE;
		else if (IS_SET(ch->res_flags, RES_WEAPON))
			def = IS_RESISTANT;
		else if (IS_SET(ch->vuln_flags, VULN_WEAPON))
			def = IS_VULNERABLE;
	}
	else /* magical attack */
	{
		if (IS_SET(ch->imm_flags, IMM_MAGIC))
			def = IS_IMMUNE;
		else if (IS_SET(ch->res_flags, RES_MAGIC))
			def = IS_RESISTANT;
		else if (IS_SET(ch->vuln_flags, VULN_MAGIC))
			def = IS_VULNERABLE;
	}

	/* set bits to check -- VULN etc. must ALL be the same or this will fail */
	switch (dam_type)
	{
		case DAM_BASH:
			bit = IMM_BASH;
			break;
		case DAM_PIERCE:
			bit = IMM_PIERCE;
			break;
		case DAM_SLASH:
			bit = IMM_SLASH;
			break;
		case DAM_FIRE:
			bit = IMM_FIRE;
			break;
		case DAM_COLD:
			bit = IMM_COLD;
			break;
		case DAM_LIGHTNING:
			bit = IMM_LIGHTNING;
			break;
		case DAM_ACID:
			bit = IMM_ACID;
			break;
		case DAM_POISON:
			bit = IMM_POISON;
			break;
		case DAM_NEGATIVE:
			bit = IMM_NEGATIVE;
			break;
		case DAM_HOLY:
			bit = IMM_HOLY;
			break;
		case DAM_ENERGY:
			bit = IMM_ENERGY;
			break;
		case DAM_MENTAL:
			bit = IMM_MENTAL;
			break;
		case DAM_DISEASE:
			bit = IMM_DISEASE;
			break;
		case DAM_DROWNING:
			bit = IMM_DROWNING;
			break;
		case DAM_LIGHT:
			bit = IMM_LIGHT;
			break;
		case DAM_CHARM:
			bit = IMM_CHARM;
			break;
		case DAM_SOUND:
			bit = IMM_SOUND;
			break;
		case DAM_INTERNAL:
			bit = IMM_INTERNAL;
			break;
		default:
			return def;
	}

	if (IS_SET(ch->imm_flags, bit))
	{
		immune = IS_IMMUNE;
	}
	else if (IS_SET(ch->res_flags, bit) && immune != IS_IMMUNE)
	{
		immune = IS_RESISTANT;
	}
	else if (IS_SET(ch->vuln_flags, bit))
	{
		if (immune == IS_IMMUNE)
			immune = IS_RESISTANT;
		else if (immune == IS_RESISTANT)
			immune = IS_NORMAL;
		else
			immune = IS_VULNERABLE;
	}

	if (immune == -1)
		return def;
	else
		return immune;
}